

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

int side4_8d_filter(double *p0,double *p1,double *p2,double *p3,double *p4,double *q0,double *q1,
                   double *q2,double *q3)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar22;
  double dVar23;
  undefined1 auVar19 [16];
  double dVar24;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar34;
  double dVar35;
  undefined1 auVar33 [16];
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar41;
  double dVar42;
  undefined1 auVar40 [16];
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  double dVar50;
  undefined1 auVar51 [16];
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar66;
  undefined1 auVar65 [16];
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar80;
  undefined1 auVar79 [16];
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar87;
  double dVar88;
  undefined1 auVar86 [16];
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar100;
  double dVar101;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar109;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar117;
  undefined1 auVar116 [16];
  double dVar118;
  double dVar119;
  undefined1 auVar120 [16];
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar128;
  undefined1 auVar127 [16];
  undefined1 local_658 [96];
  undefined1 local_5f8 [384];
  undefined1 local_478 [1144];
  
  dVar15 = p0[4];
  dVar16 = p0[5];
  dVar13 = *p0;
  dVar124 = p0[1];
  dVar14 = p0[2];
  dVar114 = p0[3];
  dVar94 = p2[2] - dVar14;
  dVar100 = q1[5] - dVar16;
  dVar52 = p3[5] - dVar16;
  dVar57 = q2[5] - dVar16;
  dVar32 = p0[6];
  dVar17 = p0[7];
  dVar53 = p1[2] - dVar14;
  dVar58 = q3[4] - dVar15;
  dVar25 = p1[5] - dVar16;
  dVar34 = q3[5] - dVar16;
  dVar121 = p3[4] - dVar15;
  dVar128 = q2[4] - dVar15;
  dVar62 = p3[6] - dVar32;
  dVar66 = q2[6] - dVar32;
  dVar82 = p2[4] - dVar15;
  dVar87 = q1[6] - dVar32;
  dVar36 = q1[4] - dVar15;
  dVar41 = p2[6] - dVar32;
  dVar54 = *p2 - dVar13;
  dVar59 = q1[2] - dVar14;
  dVar89 = *q1 - dVar13;
  dVar90 = ABS(dVar89);
  dVar9 = p2[3] - dVar114;
  dVar22 = q1[1] - dVar124;
  local_658._8_8_ = ABS(dVar22);
  local_658._0_8_ = ABS(dVar9);
  dVar28 = (double)local_658._8_8_;
  if ((double)local_658._8_8_ <= dVar90) {
    dVar28 = dVar90;
  }
  dVar60 = ABS(dVar59);
  dVar103 = dVar60;
  if (dVar60 <= dVar28) {
    dVar103 = dVar28;
  }
  dVar10 = q1[3] - dVar114;
  dVar55 = p2[1] - dVar124;
  dVar61 = ABS(dVar10);
  dVar28 = dVar61;
  if (dVar61 <= dVar103) {
    dVar28 = dVar103;
  }
  auVar65._0_8_ = ABS(dVar41);
  auVar65._8_8_ = ABS(dVar36);
  dVar103 = auVar65._8_8_;
  if (auVar65._8_8_ <= dVar28) {
    dVar103 = dVar28;
  }
  dVar101 = ABS(dVar100);
  dVar28 = dVar101;
  if (dVar101 <= dVar103) {
    dVar28 = dVar103;
  }
  dVar88 = ABS(dVar87);
  dVar103 = dVar88;
  if (dVar88 <= dVar28) {
    dVar103 = dVar28;
  }
  dVar11 = p2[7] - dVar17;
  dVar23 = q1[7] - dVar17;
  local_478._8_8_ = ABS(dVar23);
  local_478._0_8_ = ABS(dVar11);
  dVar28 = (double)local_478._8_8_;
  if ((double)local_478._8_8_ <= dVar103) {
    dVar28 = dVar103;
  }
  dVar37 = *p3 - dVar13;
  dVar42 = q2[1] - dVar124;
  dVar102 = *q2 - dVar13;
  dVar103 = ABS(dVar102);
  auVar40._0_8_ = ABS(dVar37);
  auVar40._8_8_ = ABS(dVar42);
  dVar12 = auVar40._8_8_;
  if (auVar40._8_8_ <= dVar103) {
    dVar12 = dVar103;
  }
  if (dVar103 <= dVar28) {
    dVar103 = dVar28;
  }
  dVar26 = p3[3] - dVar114;
  auVar19._0_8_ = ABS(dVar26);
  auVar19._8_8_ = dVar103;
  dVar103 = *q0 - dVar13;
  dVar109 = q0[1] - dVar124;
  dVar28 = ABS(dVar109);
  if (ABS(dVar109) <= ABS(dVar103)) {
    dVar28 = ABS(dVar103);
  }
  dVar104 = q0[2] - dVar14;
  dVar91 = ABS(dVar104);
  if (ABS(dVar104) <= dVar28) {
    dVar91 = dVar28;
  }
  dVar110 = q0[3] - dVar114;
  dVar28 = ABS(dVar110);
  if (ABS(dVar110) <= dVar91) {
    dVar28 = dVar91;
  }
  dVar105 = q0[4] - dVar15;
  dVar91 = ABS(dVar105);
  if (ABS(dVar105) <= dVar28) {
    dVar91 = dVar28;
  }
  dVar111 = q0[5] - dVar16;
  dVar28 = ABS(dVar111);
  if (ABS(dVar111) <= dVar91) {
    dVar28 = dVar91;
  }
  auVar40 = maxpd(auVar40,auVar19);
  dVar38 = p1[1] - dVar124;
  dVar43 = q3[6] - dVar32;
  dVar27 = q0[6] - dVar32;
  dVar91 = ABS(dVar27);
  if (ABS(dVar27) <= dVar28) {
    dVar91 = dVar28;
  }
  dVar106 = q0[7] - dVar17;
  dVar28 = ABS(dVar106);
  if (ABS(dVar106) <= dVar91) {
    dVar28 = dVar91;
  }
  if (dVar90 <= dVar28) {
    dVar90 = dVar28;
  }
  dVar28 = p2[5] - dVar16;
  auVar48._0_8_ = ABS(dVar28);
  auVar48._8_8_ = dVar90;
  auVar19 = maxpd(local_658._0_16_,auVar48);
  dVar91 = p3[1] - dVar124;
  dVar93 = q2[2] - dVar14;
  auVar108._0_8_ = ABS(dVar91);
  auVar108._8_8_ = ABS(dVar93);
  dVar90 = auVar108._8_8_;
  if (auVar108._8_8_ <= dVar12) {
    dVar90 = dVar12;
  }
  dVar112 = p3[2] - dVar14;
  dVar117 = q2[3] - dVar114;
  auVar116._0_8_ = ABS(dVar112);
  auVar116._8_8_ = ABS(dVar117);
  dVar12 = auVar116._8_8_;
  if (auVar116._8_8_ <= dVar90) {
    dVar12 = dVar90;
  }
  auVar120._0_8_ = ABS(dVar121);
  auVar120._8_8_ = ABS(dVar128);
  dVar90 = auVar120._8_8_;
  if (auVar120._8_8_ <= dVar12) {
    dVar90 = dVar12;
  }
  auVar127._0_8_ = ABS(dVar52);
  auVar127._8_8_ = ABS(dVar57);
  dVar12 = auVar127._8_8_;
  if (auVar127._8_8_ <= dVar90) {
    dVar12 = dVar90;
  }
  auVar107._0_8_ = ABS(dVar62);
  auVar107._8_8_ = ABS(dVar66);
  dVar90 = auVar107._8_8_;
  if (auVar107._8_8_ <= dVar12) {
    dVar90 = dVar12;
  }
  dVar76 = p3[7] - dVar17;
  dVar80 = q2[7] - dVar17;
  auVar79._0_8_ = ABS(dVar76);
  auVar79._8_8_ = ABS(dVar80);
  dVar12 = auVar79._8_8_;
  if (auVar79._8_8_ <= dVar90) {
    dVar12 = dVar90;
  }
  dVar29 = *q3 - dVar13;
  dVar90 = ABS(dVar29);
  if (ABS(dVar29) <= dVar12) {
    dVar90 = dVar12;
  }
  dVar95 = p1[4] - dVar15;
  auVar98._0_8_ = ABS(dVar95);
  auVar98._8_8_ = dVar90;
  dVar12 = p1[3] - dVar114;
  dVar24 = q3[1] - dVar124;
  auVar47._0_8_ = ABS(dVar12);
  auVar47._8_8_ = ABS(dVar24);
  auVar48 = maxpd(auVar47,auVar98);
  dVar67 = p1[7] - dVar17;
  dVar75 = q3[2] - dVar14;
  dVar83 = q3[3] - dVar114;
  dVar30 = p1[6] - dVar32;
  dVar35 = q3[7] - dVar17;
  auVar99._0_8_ = ABS(dVar53);
  auVar99._8_8_ = ABS(dVar58);
  auVar20._0_8_ = ABS(dVar25);
  auVar20._8_8_ = ABS(dVar34);
  local_5f8._8_8_ = ABS(dVar35);
  local_5f8._0_8_ = ABS(dVar30);
  dVar31 = *p1 - dVar13;
  auVar33._0_8_ = ABS(dVar31);
  auVar33._8_8_ = ABS(dVar83);
  auVar86._0_8_ = ABS(dVar38);
  auVar86._8_8_ = ABS(dVar43);
  auVar51._0_8_ = ABS(dVar67);
  auVar51._8_8_ = ABS(dVar75);
  auVar48 = maxpd(auVar51,auVar48);
  auVar48 = maxpd(auVar33,auVar48);
  auVar48 = maxpd(auVar99,auVar48);
  auVar48 = maxpd(auVar20,auVar48);
  auVar48 = maxpd(auVar86,auVar48);
  auVar40 = maxpd(auVar108,auVar40);
  auVar40 = maxpd(auVar116,auVar40);
  auVar40 = maxpd(auVar120,auVar40);
  auVar40 = maxpd(auVar127,auVar40);
  auVar108 = maxpd(auVar107,auVar40);
  auVar3._8_8_ = dVar60;
  auVar3._0_8_ = ABS(dVar54);
  auVar40 = maxpd(auVar3,auVar19);
  auVar2._8_8_ = dVar61;
  auVar2._0_8_ = ABS(dVar55);
  auVar40 = maxpd(auVar2,auVar40);
  auVar65 = maxpd(auVar65,auVar40);
  auVar1._8_8_ = dVar101;
  auVar1._0_8_ = ABS(dVar94);
  auVar65 = maxpd(auVar1,auVar65);
  auVar4._8_8_ = dVar88;
  auVar4._0_8_ = ABS(dVar82);
  auVar65 = maxpd(auVar4,auVar65);
  auVar65 = maxpd(local_478._0_16_,auVar65);
  auVar40 = maxpd(auVar79,auVar108);
  dVar61 = auVar65._0_8_;
  dVar101 = auVar65._8_8_;
  dVar90 = dVar61;
  dVar60 = dVar101;
  if ((dVar101 <= dVar61) && (dVar90 = dVar101, dVar101 < dVar61)) {
    dVar60 = dVar61;
  }
  auVar65 = maxpd(local_5f8._0_16_,auVar48);
  dVar77 = auVar40._0_8_;
  dVar81 = auVar40._8_8_;
  dVar88 = dVar77;
  if ((dVar90 <= dVar77) && (dVar88 = dVar90, dVar60 < dVar77)) {
    dVar60 = dVar77;
  }
  dVar74 = auVar65._0_8_;
  dVar126 = auVar65._8_8_;
  dVar90 = dVar74;
  if ((dVar88 <= dVar74) && (dVar90 = dVar88, dVar60 < dVar74)) {
    dVar60 = dVar74;
  }
  dVar88 = dVar126;
  if ((dVar90 <= dVar126) && (dVar88 = dVar90, dVar60 < dVar126)) {
    dVar60 = dVar126;
  }
  dVar90 = dVar81;
  if ((dVar88 <= dVar81) && (dVar90 = dVar88, dVar60 < dVar81)) {
    dVar60 = dVar81;
  }
  iVar5 = 0;
  iVar6 = 0;
  if ((2.825284831947541e-50 <= dVar90) && (iVar6 = iVar5, dVar60 <= 4.8357032784585156e+24)) {
    dVar68 = dVar11 * dVar106 +
             dVar41 * dVar27 +
             dVar28 * dVar111 +
             dVar82 * dVar105 +
             dVar9 * dVar110 + dVar94 * dVar104 + dVar54 * dVar103 + dVar55 * dVar109;
    dVar69 = dVar11 * dVar23 +
             dVar41 * dVar87 +
             dVar28 * dVar100 +
             dVar82 * dVar36 + dVar9 * dVar10 + dVar94 * dVar59 + dVar54 * dVar89 + dVar55 * dVar22;
    dVar70 = dVar67 * dVar106 +
             dVar30 * dVar27 +
             dVar25 * dVar111 +
             dVar95 * dVar105 +
             dVar12 * dVar110 + dVar53 * dVar104 + dVar31 * dVar103 + dVar38 * dVar109;
    dVar71 = dVar67 * dVar35 +
             dVar30 * dVar43 +
             dVar25 * dVar34 +
             dVar95 * dVar58 + dVar12 * dVar83 + dVar53 * dVar75 + dVar31 * dVar29 + dVar38 * dVar24
    ;
    dVar118 = dVar67 * dVar23 +
              dVar30 * dVar87 +
              dVar25 * dVar100 +
              dVar95 * dVar36 +
              dVar12 * dVar10 + dVar53 * dVar59 + dVar31 * dVar89 + dVar38 * dVar22;
    dVar122 = dVar11 * dVar35 +
              dVar41 * dVar43 +
              dVar28 * dVar34 +
              dVar82 * dVar58 + dVar9 * dVar83 + dVar94 * dVar75 + dVar54 * dVar29 + dVar55 * dVar24
    ;
    dVar44 = dVar67 * dVar80 +
             dVar30 * dVar66 +
             dVar25 * dVar57 +
             dVar95 * dVar128 +
             dVar12 * dVar117 + dVar53 * dVar93 + dVar31 * dVar102 + dVar38 * dVar42;
    dVar60 = dVar11 * dVar80 +
             dVar41 * dVar66 +
             dVar28 * dVar57 +
             dVar82 * dVar128 +
             dVar9 * dVar117 + dVar94 * dVar93 + dVar54 * dVar102 + dVar55 * dVar42;
    dVar78 = dVar76 * dVar106 +
             dVar62 * dVar27 +
             dVar52 * dVar111 +
             dVar121 * dVar105 +
             dVar26 * dVar110 + dVar112 * dVar104 + dVar37 * dVar103 + dVar91 * dVar109;
    dVar92 = dVar76 * dVar23 +
             dVar62 * dVar87 +
             dVar52 * dVar100 +
             dVar121 * dVar36 +
             dVar26 * dVar10 + dVar112 * dVar59 + dVar37 * dVar89 + dVar91 * dVar22;
    dVar84 = dVar76 * dVar80 +
             dVar62 * dVar66 +
             dVar52 * dVar57 +
             dVar121 * dVar128 +
             dVar26 * dVar117 + dVar112 * dVar93 + dVar37 * dVar102 + dVar91 * dVar42;
    dVar72 = dVar76 * dVar35 +
             dVar62 * dVar43 +
             dVar52 * dVar34 +
             dVar121 * dVar58 +
             dVar26 * dVar83 + dVar112 * dVar75 + dVar37 * dVar29 + dVar91 * dVar24;
    dVar122 = dVar122 + dVar122;
    dVar60 = dVar60 + dVar60;
    dVar84 = dVar84 + dVar84;
    dVar72 = dVar72 + dVar72;
    dVar63 = dVar60 * dVar72 - dVar84 * dVar122;
    dVar71 = dVar71 + dVar71;
    dVar44 = dVar44 + dVar44;
    dVar50 = dVar44 * dVar72 - dVar84 * dVar71;
    dVar96 = dVar44 * dVar122 - dVar60 * dVar71;
    dVar69 = dVar69 + dVar69;
    dVar92 = dVar92 + dVar92;
    dVar113 = dVar69 * dVar84 - dVar92 * dVar60;
    dVar118 = dVar118 + dVar118;
    dVar56 = dVar118 * dVar84 - dVar92 * dVar44;
    dVar123 = dVar118 * dVar60 - dVar69 * dVar44;
    dVar68 = dVar68 + dVar68;
    dVar70 = dVar70 + dVar70;
    dVar64 = dVar92 * dVar96 + (dVar118 * dVar63 - dVar50 * dVar69);
    dVar78 = dVar78 + dVar78;
    dVar85 = dVar78 * dVar96 + (dVar70 * dVar63 - dVar50 * dVar68);
    dVar88 = dVar69 * dVar72 - dVar122 * dVar92;
    dVar45 = dVar118 * dVar72 - dVar71 * dVar92;
    dVar119 = dVar118 * dVar122 - dVar71 * dVar69;
    dVar97 = dVar78 * dVar119 + (dVar70 * dVar88 - dVar45 * dVar68);
    dVar73 = dVar78 * dVar123 + (dVar70 * dVar113 - dVar56 * dVar68);
    dVar39 = ((dVar64 - dVar85) + dVar97) - dVar73;
    dVar90 = dVar74 * dVar101 * dVar61 * dVar81 * dVar77 * dVar126 * 4.3749289469473104e-11;
    if (dVar39 <= dVar90) {
      if (-dVar90 <= dVar39) {
        return 0;
      }
      iVar5 = -1;
    }
    else {
      iVar5 = 1;
    }
    dVar13 = *p4 - dVar13;
    dVar124 = p4[1] - dVar124;
    dVar14 = p4[2] - dVar14;
    dVar114 = p4[3] - dVar114;
    dVar15 = p4[4] - dVar15;
    dVar16 = p4[5] - dVar16;
    dVar32 = p4[6] - dVar32;
    dVar17 = p4[7] - dVar17;
    auVar21._8_8_ = -(ulong)(dVar101 < dVar81);
    auVar21._0_8_ = -(ulong)(dVar61 < dVar77);
    uVar7 = movmskpd((int)p2,auVar21);
    dVar90 = dVar77;
    if ((uVar7 & 1) == 0) {
      dVar90 = dVar61;
    }
    dVar115 = ABS(dVar114);
    if (ABS(dVar114) <= dVar74) {
      dVar115 = dVar74;
    }
    dVar125 = ABS(dVar124);
    if (ABS(dVar124) <= dVar115) {
      dVar125 = dVar115;
    }
    dVar115 = ABS(dVar15);
    if (ABS(dVar15) <= dVar125) {
      dVar115 = dVar125;
    }
    dVar125 = ABS(dVar13);
    if (ABS(dVar13) <= dVar115) {
      dVar125 = dVar115;
    }
    dVar115 = ABS(dVar14);
    if (ABS(dVar14) <= dVar125) {
      dVar115 = dVar125;
    }
    dVar125 = ABS(dVar16);
    if (ABS(dVar16) <= dVar115) {
      dVar125 = dVar115;
    }
    dVar115 = ABS(dVar32);
    if (ABS(dVar32) <= dVar125) {
      dVar115 = dVar125;
    }
    dVar125 = ABS(dVar17);
    if (ABS(dVar17) <= dVar115) {
      dVar125 = dVar115;
    }
    dVar115 = dVar125;
    if (dVar125 <= dVar90) {
      dVar115 = dVar90;
    }
    dVar90 = dVar74;
    if (dVar74 <= dVar115) {
      dVar90 = dVar115;
    }
    auVar49._8_8_ = -(ulong)(dVar90 < dVar126);
    auVar49._0_8_ = -(ulong)(dVar125 < dVar74);
    uVar8 = movmskpd((int)p1,auVar49);
    dVar115 = dVar126;
    if ((uVar8 & 2) == 0) {
      dVar115 = dVar90;
    }
    dVar90 = dVar74;
    if ((uVar8 & 1) == 0) {
      dVar90 = dVar125;
    }
    dVar46 = dVar81;
    if (dVar81 <= dVar90) {
      dVar46 = dVar90;
    }
    dVar90 = dVar81;
    if ((uVar7 & 2) == 0) {
      dVar90 = dVar101;
    }
    dVar18 = dVar90;
    if (dVar90 <= dVar101) {
      dVar18 = dVar101;
    }
    if (dVar74 <= dVar18) {
      dVar74 = dVar18;
    }
    if (dVar126 <= dVar74) {
      dVar126 = dVar74;
    }
    dVar101 = dVar46;
    dVar74 = dVar90;
    if ((dVar90 <= dVar46) && (dVar101 = dVar90, dVar90 < dVar46)) {
      dVar74 = dVar46;
    }
    if (dVar81 <= dVar126) {
      dVar81 = dVar126;
    }
    dVar126 = dVar115;
    if ((dVar101 <= dVar115) && (dVar126 = dVar101, dVar74 < dVar115)) {
      dVar74 = dVar115;
    }
    dVar101 = dVar61;
    if (dVar126 <= dVar61) {
      dVar101 = dVar126;
    }
    dVar126 = dVar77;
    if (dVar101 <= dVar77) {
      dVar126 = dVar101;
    }
    dVar101 = dVar125;
    if (dVar126 <= dVar125) {
      dVar101 = dVar126;
    }
    dVar126 = dVar81;
    if ((dVar101 <= dVar81) && (dVar126 = dVar101, dVar74 < dVar81)) {
      dVar74 = dVar81;
    }
    if ((4.1740251859728477e-38 <= dVar126) && (dVar74 <= 4.8357032784585156e+24)) {
      dVar74 = dVar122 * dVar78 - dVar72 * dVar68;
      dVar101 = dVar71 * dVar78 - dVar72 * dVar70;
      dVar126 = dVar71 * dVar68 - dVar122 * dVar70;
      dVar54 = dVar11 * dVar11 +
               dVar41 * dVar41 +
               dVar28 * dVar28 +
               dVar82 * dVar82 + dVar9 * dVar9 + dVar94 * dVar94 + dVar54 * dVar54 + dVar55 * dVar55
      ;
      dVar41 = dVar67 * dVar67 +
               dVar30 * dVar30 +
               dVar25 * dVar25 +
               dVar95 * dVar95 +
               dVar12 * dVar12 + dVar53 * dVar53 + dVar31 * dVar31 + dVar38 * dVar38;
      dVar28 = dVar68 * dVar92 - dVar78 * dVar69;
      dVar82 = dVar92 * dVar70 - dVar78 * dVar118;
      dVar9 = dVar70 * dVar69 - dVar68 * dVar118;
      dVar25 = dVar76 * dVar76 +
               dVar62 * dVar62 +
               dVar52 * dVar52 +
               dVar121 * dVar121 +
               dVar26 * dVar26 + dVar112 * dVar112 + dVar37 * dVar37 + dVar91 * dVar91;
      dVar52 = dVar106 * dVar17 +
               dVar27 * dVar32 +
               dVar111 * dVar16 +
               dVar105 * dVar15 +
               dVar110 * dVar114 + dVar104 * dVar14 + dVar103 * dVar13 + dVar109 * dVar124;
      dVar53 = dVar23 * dVar17 +
               dVar87 * dVar32 +
               dVar100 * dVar16 +
               dVar36 * dVar15 +
               dVar10 * dVar114 + dVar59 * dVar14 + dVar89 * dVar13 + dVar22 * dVar124;
      dVar36 = dVar80 * dVar17 +
               dVar66 * dVar32 +
               dVar57 * dVar16 +
               dVar128 * dVar15 +
               dVar117 * dVar114 + dVar93 * dVar14 + dVar102 * dVar13 + dVar42 * dVar124;
      dVar22 = dVar35 * dVar17 +
               dVar43 * dVar32 +
               dVar34 * dVar16 +
               dVar58 * dVar15 +
               dVar83 * dVar114 + dVar75 * dVar14 + dVar29 * dVar13 + dVar24 * dVar124;
      dVar16 = dVar39 * (dVar17 * dVar17 +
                        dVar32 * dVar32 +
                        dVar16 * dVar16 +
                        dVar15 * dVar15 +
                        dVar114 * dVar114 + dVar14 * dVar14 + dVar13 * dVar13 + dVar124 * dVar124) -
               (((((dVar44 * dVar68 - dVar60 * dVar70) + dVar123 + dVar9) * dVar25 +
                 (((dVar60 * dVar78 - dVar68 * dVar84) + dVar113 + dVar28) * dVar41 -
                 ((dVar44 * dVar78 - dVar84 * dVar70) + dVar56 + dVar82) * dVar54)) - dVar73) *
                (dVar22 + dVar22) +
               (dVar97 + (((dVar45 + dVar101 + dVar82) * dVar54 -
                          (dVar88 + dVar74 + dVar28) * dVar41) -
                         (dVar119 + dVar126 + dVar9) * dVar25)) * (dVar36 + dVar36) +
               ((((dVar60 * dVar70 - dVar44 * dVar68) + dVar96 + dVar126) * dVar25 +
                (((dVar68 * dVar84 - dVar60 * dVar78) + dVar63 + dVar74) * dVar41 -
                ((dVar84 * dVar70 - dVar44 * dVar78) + dVar50 + dVar101) * dVar54)) - dVar85) *
               (dVar53 + dVar53) +
               (dVar64 + ((((dVar71 * dVar92 - dVar118 * dVar72) + dVar50 + dVar56) * dVar54 -
                          ((dVar122 * dVar92 - dVar69 * dVar72) + dVar63 + dVar113) * dVar41) -
                         ((dVar71 * dVar69 - dVar118 * dVar122) + dVar96 + dVar123) * dVar25)) *
               (dVar52 + dVar52));
      dVar15 = dVar115 * dVar46 * dVar125 * dVar90 * dVar61 * dVar81 * dVar77 * dVar81 *
               2.4149264560725403e-09;
      if (dVar16 <= dVar15) {
        if (-dVar15 <= dVar16) {
          return 0;
        }
        iVar6 = -1;
      }
      else {
        iVar6 = 1;
      }
      iVar6 = iVar6 * iVar5;
    }
  }
  return iVar6;
}

Assistant:

inline int side4_8d_filter( const double* p0, const double* p1, const double* p2, const double* p3, const double* p4, const double* q0, const double* q1, const double* q2, const double* q3) {
    double p1_0_p0_0 = (p1[0] - p0[0]);
    double p1_1_p0_1 = (p1[1] - p0[1]);
    double p1_2_p0_2 = (p1[2] - p0[2]);
    double p1_3_p0_3 = (p1[3] - p0[3]);
    double p1_4_p0_4 = (p1[4] - p0[4]);
    double p1_5_p0_5 = (p1[5] - p0[5]);
    double p1_6_p0_6 = (p1[6] - p0[6]);
    double p1_7_p0_7 = (p1[7] - p0[7]);
    double l1;
    l1 = (1 * ((((((((p1_0_p0_0 * p1_0_p0_0) + (p1_1_p0_1 * p1_1_p0_1)) + (p1_2_p0_2 * p1_2_p0_2)) + (p1_3_p0_3 * p1_3_p0_3)) + (p1_4_p0_4 * p1_4_p0_4)) + (p1_5_p0_5 * p1_5_p0_5)) + (p1_6_p0_6 * p1_6_p0_6)) + (p1_7_p0_7 * p1_7_p0_7)));
    double p2_0_p0_0 = (p2[0] - p0[0]);
    double p2_1_p0_1 = (p2[1] - p0[1]);
    double p2_2_p0_2 = (p2[2] - p0[2]);
    double p2_3_p0_3 = (p2[3] - p0[3]);
    double p2_4_p0_4 = (p2[4] - p0[4]);
    double p2_5_p0_5 = (p2[5] - p0[5]);
    double p2_6_p0_6 = (p2[6] - p0[6]);
    double p2_7_p0_7 = (p2[7] - p0[7]);
    double l2;
    l2 = (1 * ((((((((p2_0_p0_0 * p2_0_p0_0) + (p2_1_p0_1 * p2_1_p0_1)) + (p2_2_p0_2 * p2_2_p0_2)) + (p2_3_p0_3 * p2_3_p0_3)) + (p2_4_p0_4 * p2_4_p0_4)) + (p2_5_p0_5 * p2_5_p0_5)) + (p2_6_p0_6 * p2_6_p0_6)) + (p2_7_p0_7 * p2_7_p0_7)));
    double p3_0_p0_0 = (p3[0] - p0[0]);
    double p3_1_p0_1 = (p3[1] - p0[1]);
    double p3_2_p0_2 = (p3[2] - p0[2]);
    double p3_3_p0_3 = (p3[3] - p0[3]);
    double p3_4_p0_4 = (p3[4] - p0[4]);
    double p3_5_p0_5 = (p3[5] - p0[5]);
    double p3_6_p0_6 = (p3[6] - p0[6]);
    double p3_7_p0_7 = (p3[7] - p0[7]);
    double l3;
    l3 = (1 * ((((((((p3_0_p0_0 * p3_0_p0_0) + (p3_1_p0_1 * p3_1_p0_1)) + (p3_2_p0_2 * p3_2_p0_2)) + (p3_3_p0_3 * p3_3_p0_3)) + (p3_4_p0_4 * p3_4_p0_4)) + (p3_5_p0_5 * p3_5_p0_5)) + (p3_6_p0_6 * p3_6_p0_6)) + (p3_7_p0_7 * p3_7_p0_7)));
    double p4_0_p0_0 = (p4[0] - p0[0]);
    double p4_1_p0_1 = (p4[1] - p0[1]);
    double p4_2_p0_2 = (p4[2] - p0[2]);
    double p4_3_p0_3 = (p4[3] - p0[3]);
    double p4_4_p0_4 = (p4[4] - p0[4]);
    double p4_5_p0_5 = (p4[5] - p0[5]);
    double p4_6_p0_6 = (p4[6] - p0[6]);
    double p4_7_p0_7 = (p4[7] - p0[7]);
    double l4;
    l4 = (1 * ((((((((p4_0_p0_0 * p4_0_p0_0) + (p4_1_p0_1 * p4_1_p0_1)) + (p4_2_p0_2 * p4_2_p0_2)) + (p4_3_p0_3 * p4_3_p0_3)) + (p4_4_p0_4 * p4_4_p0_4)) + (p4_5_p0_5 * p4_5_p0_5)) + (p4_6_p0_6 * p4_6_p0_6)) + (p4_7_p0_7 * p4_7_p0_7)));
    double q0_0_p0_0 = (q0[0] - p0[0]);
    double q0_1_p0_1 = (q0[1] - p0[1]);
    double q0_2_p0_2 = (q0[2] - p0[2]);
    double q0_3_p0_3 = (q0[3] - p0[3]);
    double q0_4_p0_4 = (q0[4] - p0[4]);
    double q0_5_p0_5 = (q0[5] - p0[5]);
    double q0_6_p0_6 = (q0[6] - p0[6]);
    double q0_7_p0_7 = (q0[7] - p0[7]);
    double a10;
    a10 = (2 * ((((((((p1_0_p0_0 * q0_0_p0_0) + (p1_1_p0_1 * q0_1_p0_1)) + (p1_2_p0_2 * q0_2_p0_2)) + (p1_3_p0_3 * q0_3_p0_3)) + (p1_4_p0_4 * q0_4_p0_4)) + (p1_5_p0_5 * q0_5_p0_5)) + (p1_6_p0_6 * q0_6_p0_6)) + (p1_7_p0_7 * q0_7_p0_7)));
    double q1_0_p0_0 = (q1[0] - p0[0]);
    double q1_1_p0_1 = (q1[1] - p0[1]);
    double q1_2_p0_2 = (q1[2] - p0[2]);
    double q1_3_p0_3 = (q1[3] - p0[3]);
    double q1_4_p0_4 = (q1[4] - p0[4]);
    double q1_5_p0_5 = (q1[5] - p0[5]);
    double q1_6_p0_6 = (q1[6] - p0[6]);
    double q1_7_p0_7 = (q1[7] - p0[7]);
    double a11;
    a11 = (2 * ((((((((p1_0_p0_0 * q1_0_p0_0) + (p1_1_p0_1 * q1_1_p0_1)) + (p1_2_p0_2 * q1_2_p0_2)) + (p1_3_p0_3 * q1_3_p0_3)) + (p1_4_p0_4 * q1_4_p0_4)) + (p1_5_p0_5 * q1_5_p0_5)) + (p1_6_p0_6 * q1_6_p0_6)) + (p1_7_p0_7 * q1_7_p0_7)));
    double q2_0_p0_0 = (q2[0] - p0[0]);
    double q2_1_p0_1 = (q2[1] - p0[1]);
    double q2_2_p0_2 = (q2[2] - p0[2]);
    double q2_3_p0_3 = (q2[3] - p0[3]);
    double q2_4_p0_4 = (q2[4] - p0[4]);
    double q2_5_p0_5 = (q2[5] - p0[5]);
    double q2_6_p0_6 = (q2[6] - p0[6]);
    double q2_7_p0_7 = (q2[7] - p0[7]);
    double a12;
    a12 = (2 * ((((((((p1_0_p0_0 * q2_0_p0_0) + (p1_1_p0_1 * q2_1_p0_1)) + (p1_2_p0_2 * q2_2_p0_2)) + (p1_3_p0_3 * q2_3_p0_3)) + (p1_4_p0_4 * q2_4_p0_4)) + (p1_5_p0_5 * q2_5_p0_5)) + (p1_6_p0_6 * q2_6_p0_6)) + (p1_7_p0_7 * q2_7_p0_7)));
    double q3_0_p0_0 = (q3[0] - p0[0]);
    double q3_1_p0_1 = (q3[1] - p0[1]);
    double q3_2_p0_2 = (q3[2] - p0[2]);
    double q3_3_p0_3 = (q3[3] - p0[3]);
    double q3_4_p0_4 = (q3[4] - p0[4]);
    double q3_5_p0_5 = (q3[5] - p0[5]);
    double q3_6_p0_6 = (q3[6] - p0[6]);
    double q3_7_p0_7 = (q3[7] - p0[7]);
    double a13;
    a13 = (2 * ((((((((p1_0_p0_0 * q3_0_p0_0) + (p1_1_p0_1 * q3_1_p0_1)) + (p1_2_p0_2 * q3_2_p0_2)) + (p1_3_p0_3 * q3_3_p0_3)) + (p1_4_p0_4 * q3_4_p0_4)) + (p1_5_p0_5 * q3_5_p0_5)) + (p1_6_p0_6 * q3_6_p0_6)) + (p1_7_p0_7 * q3_7_p0_7)));
    double a20;
    a20 = (2 * ((((((((p2_0_p0_0 * q0_0_p0_0) + (p2_1_p0_1 * q0_1_p0_1)) + (p2_2_p0_2 * q0_2_p0_2)) + (p2_3_p0_3 * q0_3_p0_3)) + (p2_4_p0_4 * q0_4_p0_4)) + (p2_5_p0_5 * q0_5_p0_5)) + (p2_6_p0_6 * q0_6_p0_6)) + (p2_7_p0_7 * q0_7_p0_7)));
    double a21;
    a21 = (2 * ((((((((p2_0_p0_0 * q1_0_p0_0) + (p2_1_p0_1 * q1_1_p0_1)) + (p2_2_p0_2 * q1_2_p0_2)) + (p2_3_p0_3 * q1_3_p0_3)) + (p2_4_p0_4 * q1_4_p0_4)) + (p2_5_p0_5 * q1_5_p0_5)) + (p2_6_p0_6 * q1_6_p0_6)) + (p2_7_p0_7 * q1_7_p0_7)));
    double a22;
    a22 = (2 * ((((((((p2_0_p0_0 * q2_0_p0_0) + (p2_1_p0_1 * q2_1_p0_1)) + (p2_2_p0_2 * q2_2_p0_2)) + (p2_3_p0_3 * q2_3_p0_3)) + (p2_4_p0_4 * q2_4_p0_4)) + (p2_5_p0_5 * q2_5_p0_5)) + (p2_6_p0_6 * q2_6_p0_6)) + (p2_7_p0_7 * q2_7_p0_7)));
    double a23;
    a23 = (2 * ((((((((p2_0_p0_0 * q3_0_p0_0) + (p2_1_p0_1 * q3_1_p0_1)) + (p2_2_p0_2 * q3_2_p0_2)) + (p2_3_p0_3 * q3_3_p0_3)) + (p2_4_p0_4 * q3_4_p0_4)) + (p2_5_p0_5 * q3_5_p0_5)) + (p2_6_p0_6 * q3_6_p0_6)) + (p2_7_p0_7 * q3_7_p0_7)));
    double a30;
    a30 = (2 * ((((((((p3_0_p0_0 * q0_0_p0_0) + (p3_1_p0_1 * q0_1_p0_1)) + (p3_2_p0_2 * q0_2_p0_2)) + (p3_3_p0_3 * q0_3_p0_3)) + (p3_4_p0_4 * q0_4_p0_4)) + (p3_5_p0_5 * q0_5_p0_5)) + (p3_6_p0_6 * q0_6_p0_6)) + (p3_7_p0_7 * q0_7_p0_7)));
    double a31;
    a31 = (2 * ((((((((p3_0_p0_0 * q1_0_p0_0) + (p3_1_p0_1 * q1_1_p0_1)) + (p3_2_p0_2 * q1_2_p0_2)) + (p3_3_p0_3 * q1_3_p0_3)) + (p3_4_p0_4 * q1_4_p0_4)) + (p3_5_p0_5 * q1_5_p0_5)) + (p3_6_p0_6 * q1_6_p0_6)) + (p3_7_p0_7 * q1_7_p0_7)));
    double a32;
    a32 = (2 * ((((((((p3_0_p0_0 * q2_0_p0_0) + (p3_1_p0_1 * q2_1_p0_1)) + (p3_2_p0_2 * q2_2_p0_2)) + (p3_3_p0_3 * q2_3_p0_3)) + (p3_4_p0_4 * q2_4_p0_4)) + (p3_5_p0_5 * q2_5_p0_5)) + (p3_6_p0_6 * q2_6_p0_6)) + (p3_7_p0_7 * q2_7_p0_7)));
    double a33;
    a33 = (2 * ((((((((p3_0_p0_0 * q3_0_p0_0) + (p3_1_p0_1 * q3_1_p0_1)) + (p3_2_p0_2 * q3_2_p0_2)) + (p3_3_p0_3 * q3_3_p0_3)) + (p3_4_p0_4 * q3_4_p0_4)) + (p3_5_p0_5 * q3_5_p0_5)) + (p3_6_p0_6 * q3_6_p0_6)) + (p3_7_p0_7 * q3_7_p0_7)));
    double a40;
    a40 = (2 * ((((((((p4_0_p0_0 * q0_0_p0_0) + (p4_1_p0_1 * q0_1_p0_1)) + (p4_2_p0_2 * q0_2_p0_2)) + (p4_3_p0_3 * q0_3_p0_3)) + (p4_4_p0_4 * q0_4_p0_4)) + (p4_5_p0_5 * q0_5_p0_5)) + (p4_6_p0_6 * q0_6_p0_6)) + (p4_7_p0_7 * q0_7_p0_7)));
    double a41;
    a41 = (2 * ((((((((p4_0_p0_0 * q1_0_p0_0) + (p4_1_p0_1 * q1_1_p0_1)) + (p4_2_p0_2 * q1_2_p0_2)) + (p4_3_p0_3 * q1_3_p0_3)) + (p4_4_p0_4 * q1_4_p0_4)) + (p4_5_p0_5 * q1_5_p0_5)) + (p4_6_p0_6 * q1_6_p0_6)) + (p4_7_p0_7 * q1_7_p0_7)));
    double a42;
    a42 = (2 * ((((((((p4_0_p0_0 * q2_0_p0_0) + (p4_1_p0_1 * q2_1_p0_1)) + (p4_2_p0_2 * q2_2_p0_2)) + (p4_3_p0_3 * q2_3_p0_3)) + (p4_4_p0_4 * q2_4_p0_4)) + (p4_5_p0_5 * q2_5_p0_5)) + (p4_6_p0_6 * q2_6_p0_6)) + (p4_7_p0_7 * q2_7_p0_7)));
    double a43;
    a43 = (2 * ((((((((p4_0_p0_0 * q3_0_p0_0) + (p4_1_p0_1 * q3_1_p0_1)) + (p4_2_p0_2 * q3_2_p0_2)) + (p4_3_p0_3 * q3_3_p0_3)) + (p4_4_p0_4 * q3_4_p0_4)) + (p4_5_p0_5 * q3_5_p0_5)) + (p4_6_p0_6 * q3_6_p0_6)) + (p4_7_p0_7 * q3_7_p0_7)));
    double b00;
    b00 = (((a11 * ((a22 * a33) - (a23 * a32))) - (a21 * ((a12 * a33) - (a13 * a32)))) + (a31 * ((a12 * a23) - (a13 * a22))));
    double b01;
    b01 = -((((a22 * a33) - (a23 * a32)) + ((a23 * a31) - (a21 * a33))) + ((a21 * a32) - (a22 * a31)));
    double b02;
    b02 = ((((a12 * a33) - (a13 * a32)) + ((a13 * a31) - (a11 * a33))) + ((a11 * a32) - (a12 * a31)));
    double b03;
    b03 = -((((a12 * a23) - (a13 * a22)) + ((a13 * a21) - (a11 * a23))) + ((a11 * a22) - (a12 * a21)));
    double b10;
    b10 = -(((a10 * ((a22 * a33) - (a23 * a32))) - (a20 * ((a12 * a33) - (a13 * a32)))) + (a30 * ((a12 * a23) - (a13 * a22))));
    double b11;
    b11 = ((((a22 * a33) - (a23 * a32)) + ((a23 * a30) - (a20 * a33))) + ((a20 * a32) - (a22 * a30)));
    double b12;
    b12 = -((((a12 * a33) - (a13 * a32)) + ((a13 * a30) - (a10 * a33))) + ((a10 * a32) - (a12 * a30)));
    double b13;
    b13 = ((((a12 * a23) - (a13 * a22)) + ((a13 * a20) - (a10 * a23))) + ((a10 * a22) - (a12 * a20)));
    double b20;
    b20 = (((a10 * ((a21 * a33) - (a23 * a31))) - (a20 * ((a11 * a33) - (a13 * a31)))) + (a30 * ((a11 * a23) - (a13 * a21))));
    double b21;
    b21 = -((((a21 * a33) - (a23 * a31)) + ((a23 * a30) - (a20 * a33))) + ((a20 * a31) - (a21 * a30)));
    double b22;
    b22 = ((((a11 * a33) - (a13 * a31)) + ((a13 * a30) - (a10 * a33))) + ((a10 * a31) - (a11 * a30)));
    double b23;
    b23 = -((((a11 * a23) - (a13 * a21)) + ((a13 * a20) - (a10 * a23))) + ((a10 * a21) - (a11 * a20)));
    double b30;
    b30 = -(((a10 * ((a21 * a32) - (a22 * a31))) - (a20 * ((a11 * a32) - (a12 * a31)))) + (a30 * ((a11 * a22) - (a12 * a21))));
    double b31;
    b31 = ((((a21 * a32) - (a22 * a31)) + ((a22 * a30) - (a20 * a32))) + ((a20 * a31) - (a21 * a30)));
    double b32;
    b32 = -((((a11 * a32) - (a12 * a31)) + ((a12 * a30) - (a10 * a32))) + ((a10 * a31) - (a11 * a30)));
    double b33;
    b33 = ((((a11 * a22) - (a12 * a21)) + ((a12 * a20) - (a10 * a22))) + ((a10 * a21) - (a11 * a20)));
    double Delta;
    Delta = (((b00 + b10) + b20) + b30);
    double DeltaLambda0;
    DeltaLambda0 = ((((b01 * l1) + (b02 * l2)) + (b03 * l3)) + b00);
    double DeltaLambda1;
    DeltaLambda1 = ((((b11 * l1) + (b12 * l2)) + (b13 * l3)) + b10);
    double DeltaLambda2;
    DeltaLambda2 = ((((b21 * l1) + (b22 * l2)) + (b23 * l3)) + b20);
    double DeltaLambda3;
    DeltaLambda3 = ((((b31 * l1) + (b32 * l2)) + (b33 * l3)) + b30);
    double r;
    r = ((Delta * l4) - ((((a40 * DeltaLambda0) + (a41 * DeltaLambda1)) + (a42 * DeltaLambda2)) + (a43 * DeltaLambda3)));
    double eps;
    double max1 = fabs(p2_5_p0_5);
    if( (max1 < fabs(p2_3_p0_3)) )
    {
        max1 = fabs(p2_3_p0_3);
    } 
    if( (max1 < fabs(p2_0_p0_0)) )
    {
        max1 = fabs(p2_0_p0_0);
    } 
    if( (max1 < fabs(p2_1_p0_1)) )
    {
        max1 = fabs(p2_1_p0_1);
    } 
    if( (max1 < fabs(p2_6_p0_6)) )
    {
        max1 = fabs(p2_6_p0_6);
    } 
    if( (max1 < fabs(p2_2_p0_2)) )
    {
        max1 = fabs(p2_2_p0_2);
    } 
    if( (max1 < fabs(p2_4_p0_4)) )
    {
        max1 = fabs(p2_4_p0_4);
    } 
    if( (max1 < fabs(p2_7_p0_7)) )
    {
        max1 = fabs(p2_7_p0_7);
    } 
    double max2 = fabs(p1_4_p0_4);
    if( (max2 < fabs(p1_3_p0_3)) )
    {
        max2 = fabs(p1_3_p0_3);
    } 
    if( (max2 < fabs(p1_7_p0_7)) )
    {
        max2 = fabs(p1_7_p0_7);
    } 
    if( (max2 < fabs(p1_0_p0_0)) )
    {
        max2 = fabs(p1_0_p0_0);
    } 
    if( (max2 < fabs(p1_2_p0_2)) )
    {
        max2 = fabs(p1_2_p0_2);
    } 
    if( (max2 < fabs(p1_5_p0_5)) )
    {
        max2 = fabs(p1_5_p0_5);
    } 
    if( (max2 < fabs(p1_1_p0_1)) )
    {
        max2 = fabs(p1_1_p0_1);
    } 
    if( (max2 < fabs(p1_6_p0_6)) )
    {
        max2 = fabs(p1_6_p0_6);
    } 
    double max3 = fabs(p3_3_p0_3);
    if( (max3 < fabs(p3_0_p0_0)) )
    {
        max3 = fabs(p3_0_p0_0);
    } 
    if( (max3 < fabs(p3_1_p0_1)) )
    {
        max3 = fabs(p3_1_p0_1);
    } 
    if( (max3 < fabs(p3_2_p0_2)) )
    {
        max3 = fabs(p3_2_p0_2);
    } 
    if( (max3 < fabs(p3_4_p0_4)) )
    {
        max3 = fabs(p3_4_p0_4);
    } 
    if( (max3 < fabs(p3_5_p0_5)) )
    {
        max3 = fabs(p3_5_p0_5);
    } 
    if( (max3 < fabs(p3_6_p0_6)) )
    {
        max3 = fabs(p3_6_p0_6);
    } 
    if( (max3 < fabs(p3_7_p0_7)) )
    {
        max3 = fabs(p3_7_p0_7);
    } 
    double max4 = fabs(q0_0_p0_0);
    if( (max4 < fabs(q0_1_p0_1)) )
    {
        max4 = fabs(q0_1_p0_1);
    } 
    if( (max4 < fabs(q0_2_p0_2)) )
    {
        max4 = fabs(q0_2_p0_2);
    } 
    if( (max4 < fabs(q0_3_p0_3)) )
    {
        max4 = fabs(q0_3_p0_3);
    } 
    if( (max4 < fabs(q0_4_p0_4)) )
    {
        max4 = fabs(q0_4_p0_4);
    } 
    if( (max4 < fabs(q0_5_p0_5)) )
    {
        max4 = fabs(q0_5_p0_5);
    } 
    if( (max4 < fabs(q0_6_p0_6)) )
    {
        max4 = fabs(q0_6_p0_6);
    } 
    if( (max4 < fabs(q0_7_p0_7)) )
    {
        max4 = fabs(q0_7_p0_7);
    } 
    if( (max4 < fabs(q1_0_p0_0)) )
    {
        max4 = fabs(q1_0_p0_0);
    } 
    if( (max4 < fabs(q1_1_p0_1)) )
    {
        max4 = fabs(q1_1_p0_1);
    } 
    if( (max4 < fabs(q1_2_p0_2)) )
    {
        max4 = fabs(q1_2_p0_2);
    } 
    if( (max4 < fabs(q1_3_p0_3)) )
    {
        max4 = fabs(q1_3_p0_3);
    } 
    if( (max4 < fabs(q1_4_p0_4)) )
    {
        max4 = fabs(q1_4_p0_4);
    } 
    if( (max4 < fabs(q1_5_p0_5)) )
    {
        max4 = fabs(q1_5_p0_5);
    } 
    if( (max4 < fabs(q1_6_p0_6)) )
    {
        max4 = fabs(q1_6_p0_6);
    } 
    if( (max4 < fabs(q1_7_p0_7)) )
    {
        max4 = fabs(q1_7_p0_7);
    } 
    double max5 = fabs(q1_0_p0_0);
    if( (max5 < fabs(q1_1_p0_1)) )
    {
        max5 = fabs(q1_1_p0_1);
    } 
    if( (max5 < fabs(q1_2_p0_2)) )
    {
        max5 = fabs(q1_2_p0_2);
    } 
    if( (max5 < fabs(q1_3_p0_3)) )
    {
        max5 = fabs(q1_3_p0_3);
    } 
    if( (max5 < fabs(q1_4_p0_4)) )
    {
        max5 = fabs(q1_4_p0_4);
    } 
    if( (max5 < fabs(q1_5_p0_5)) )
    {
        max5 = fabs(q1_5_p0_5);
    } 
    if( (max5 < fabs(q1_6_p0_6)) )
    {
        max5 = fabs(q1_6_p0_6);
    } 
    if( (max5 < fabs(q1_7_p0_7)) )
    {
        max5 = fabs(q1_7_p0_7);
    } 
    if( (max5 < fabs(q2_0_p0_0)) )
    {
        max5 = fabs(q2_0_p0_0);
    } 
    if( (max5 < fabs(q2_1_p0_1)) )
    {
        max5 = fabs(q2_1_p0_1);
    } 
    if( (max5 < fabs(q2_2_p0_2)) )
    {
        max5 = fabs(q2_2_p0_2);
    } 
    if( (max5 < fabs(q2_3_p0_3)) )
    {
        max5 = fabs(q2_3_p0_3);
    } 
    if( (max5 < fabs(q2_4_p0_4)) )
    {
        max5 = fabs(q2_4_p0_4);
    } 
    if( (max5 < fabs(q2_5_p0_5)) )
    {
        max5 = fabs(q2_5_p0_5);
    } 
    if( (max5 < fabs(q2_6_p0_6)) )
    {
        max5 = fabs(q2_6_p0_6);
    } 
    if( (max5 < fabs(q2_7_p0_7)) )
    {
        max5 = fabs(q2_7_p0_7);
    } 
    double max6 = fabs(q2_0_p0_0);
    if( (max6 < fabs(q2_1_p0_1)) )
    {
        max6 = fabs(q2_1_p0_1);
    } 
    if( (max6 < fabs(q2_2_p0_2)) )
    {
        max6 = fabs(q2_2_p0_2);
    } 
    if( (max6 < fabs(q2_3_p0_3)) )
    {
        max6 = fabs(q2_3_p0_3);
    } 
    if( (max6 < fabs(q2_4_p0_4)) )
    {
        max6 = fabs(q2_4_p0_4);
    } 
    if( (max6 < fabs(q2_5_p0_5)) )
    {
        max6 = fabs(q2_5_p0_5);
    } 
    if( (max6 < fabs(q2_6_p0_6)) )
    {
        max6 = fabs(q2_6_p0_6);
    } 
    if( (max6 < fabs(q2_7_p0_7)) )
    {
        max6 = fabs(q2_7_p0_7);
    } 
    if( (max6 < fabs(q3_0_p0_0)) )
    {
        max6 = fabs(q3_0_p0_0);
    } 
    if( (max6 < fabs(q3_1_p0_1)) )
    {
        max6 = fabs(q3_1_p0_1);
    } 
    if( (max6 < fabs(q3_2_p0_2)) )
    {
        max6 = fabs(q3_2_p0_2);
    } 
    if( (max6 < fabs(q3_3_p0_3)) )
    {
        max6 = fabs(q3_3_p0_3);
    } 
    if( (max6 < fabs(q3_4_p0_4)) )
    {
        max6 = fabs(q3_4_p0_4);
    } 
    if( (max6 < fabs(q3_5_p0_5)) )
    {
        max6 = fabs(q3_5_p0_5);
    } 
    if( (max6 < fabs(q3_6_p0_6)) )
    {
        max6 = fabs(q3_6_p0_6);
    } 
    if( (max6 < fabs(q3_7_p0_7)) )
    {
        max6 = fabs(q3_7_p0_7);
    } 
    double lower_bound_1;
    double upper_bound_1;
    int Delta_sign;
    int int_tmp_result;
    lower_bound_1 = max4;
    upper_bound_1 = max4;
    if( (max1 < lower_bound_1) )
    {
        lower_bound_1 = max1;
    } 
    else 
    {
        if( (max1 > upper_bound_1) )
        {
            upper_bound_1 = max1;
        } 
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    else 
    {
        if( (max3 > upper_bound_1) )
        {
            upper_bound_1 = max3;
        } 
    } 
    if( (max2 < lower_bound_1) )
    {
        lower_bound_1 = max2;
    } 
    else 
    {
        if( (max2 > upper_bound_1) )
        {
            upper_bound_1 = max2;
        } 
    } 
    if( (max6 < lower_bound_1) )
    {
        lower_bound_1 = max6;
    } 
    else 
    {
        if( (max6 > upper_bound_1) )
        {
            upper_bound_1 = max6;
        } 
    } 
    if( (max5 < lower_bound_1) )
    {
        lower_bound_1 = max5;
    } 
    else 
    {
        if( (max5 > upper_bound_1) )
        {
            upper_bound_1 = max5;
        } 
    } 
    if( (lower_bound_1 < 2.82528483194754087282e-50) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 4.83570327845851562508e+24) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (4.37492894694731040560e-11 * (((((max2 * max4) * max1) * max5) * max3) * max6));
        if( (Delta > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (Delta < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    Delta_sign = int_tmp_result;
    int int_tmp_result_FFWKCAA;
    double max7 = max1;
    if( (max7 < max3) )
    {
        max7 = max3;
    } 
    double max8 = max2;
    if( (max8 < fabs(p4_3_p0_3)) )
    {
        max8 = fabs(p4_3_p0_3);
    } 
    if( (max8 < fabs(p4_1_p0_1)) )
    {
        max8 = fabs(p4_1_p0_1);
    } 
    if( (max8 < fabs(p4_4_p0_4)) )
    {
        max8 = fabs(p4_4_p0_4);
    } 
    if( (max8 < fabs(p4_0_p0_0)) )
    {
        max8 = fabs(p4_0_p0_0);
    } 
    if( (max8 < fabs(p4_2_p0_2)) )
    {
        max8 = fabs(p4_2_p0_2);
    } 
    if( (max8 < fabs(p4_5_p0_5)) )
    {
        max8 = fabs(p4_5_p0_5);
    } 
    if( (max8 < fabs(p4_6_p0_6)) )
    {
        max8 = fabs(p4_6_p0_6);
    } 
    if( (max8 < fabs(p4_7_p0_7)) )
    {
        max8 = fabs(p4_7_p0_7);
    } 
    if( (max7 < max8) )
    {
        max7 = max8;
    } 
    if( (max7 < max2) )
    {
        max7 = max2;
    } 
    if( (max7 < max6) )
    {
        max7 = max6;
    } 
    double max9 = max8;
    if( (max9 < max2) )
    {
        max9 = max2;
    } 
    if( (max9 < max5) )
    {
        max9 = max5;
    } 
    double max10 = max4;
    double max11 = max4;
    if( (max11 < max5) )
    {
        max11 = max5;
    } 
    if( (max10 < max11) )
    {
        max10 = max11;
    } 
    if( (max10 < max2) )
    {
        max10 = max2;
    } 
    if( (max10 < max6) )
    {
        max10 = max6;
    } 
    if( (max10 < max5) )
    {
        max10 = max5;
    } 
    lower_bound_1 = max11;
    upper_bound_1 = max11;
    if( (max9 < lower_bound_1) )
    {
        lower_bound_1 = max9;
    } 
    else 
    {
        if( (max9 > upper_bound_1) )
        {
            upper_bound_1 = max9;
        } 
    } 
    if( (max7 < lower_bound_1) )
    {
        lower_bound_1 = max7;
    } 
    else 
    {
        if( (max7 > upper_bound_1) )
        {
            upper_bound_1 = max7;
        } 
    } 
    if( (max1 < lower_bound_1) )
    {
        lower_bound_1 = max1;
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    if( (max8 < lower_bound_1) )
    {
        lower_bound_1 = max8;
    } 
    if( (max10 < lower_bound_1) )
    {
        lower_bound_1 = max10;
    } 
    else 
    {
        if( (max10 > upper_bound_1) )
        {
            upper_bound_1 = max10;
        } 
    } 
    if( (lower_bound_1 < 4.17402518597284772324e-38) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 4.83570327845851562508e+24) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (2.41492645607254025015e-09 * (((((((max8 * max11) * max1) * max10) * max3) * max10) * max9) * max7));
        if( (r > eps) )
        {
            int_tmp_result_FFWKCAA = 1;
        } 
        else 
        {
            if( (r < -eps) )
            {
                int_tmp_result_FFWKCAA = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    return (Delta_sign * int_tmp_result_FFWKCAA);
}